

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-pause.c
# Opt level: O1

void cw_pause_close(Curl_easy *data,Curl_cwriter *writer)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  pvVar1 = writer->ctx;
  puVar3 = *(undefined8 **)((long)pvVar1 + 0x20);
  while (puVar3 != (undefined8 *)0x0) {
    puVar2 = (undefined8 *)*puVar3;
    Curl_bufq_free((bufq *)(puVar3 + 1));
    (*Curl_cfree)(puVar3);
    *(undefined8 **)((long)pvVar1 + 0x20) = puVar2;
    puVar3 = puVar2;
  }
  return;
}

Assistant:

static void cw_pause_close(struct Curl_easy *data, struct Curl_cwriter *writer)
{
  struct cw_pause_ctx *ctx = writer->ctx;

  (void)data;
  cw_pause_bufs_free(ctx);
}